

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::type_caster_generic::load_value(type_caster_generic *this,value_and_holder *v_h)

{
  void **ppvVar1;
  void *pvVar2;
  type_info *local_38;
  type_info *type;
  void **vptr;
  value_and_holder *v_h_local;
  type_caster_generic *this_local;
  
  ppvVar1 = value_and_holder::value_ptr<void>(v_h);
  if (*ppvVar1 == (void *)0x0) {
    if (v_h->type == (type_info *)0x0) {
      local_38 = this->typeinfo;
    }
    else {
      local_38 = v_h->type;
    }
    if (local_38->operator_new == (_func_void_ptr_size_t *)0x0) {
      pvVar2 = operator_new(local_38->type_size);
      *ppvVar1 = pvVar2;
    }
    else {
      pvVar2 = (*local_38->operator_new)(local_38->type_size);
      *ppvVar1 = pvVar2;
    }
  }
  this->value = *ppvVar1;
  return;
}

Assistant:

void load_value(value_and_holder &&v_h) {
        auto *&vptr = v_h.value_ptr();
        // Lazy allocation for unallocated values:
        if (vptr == nullptr) {
            auto *type = v_h.type ? v_h.type : typeinfo;
            if (type->operator_new) {
                vptr = type->operator_new(type->type_size);
            } else {
                #if defined(__cpp_aligned_new) && (!defined(_MSC_VER) || _MSC_VER >= 1912)
                    if (type->type_align > __STDCPP_DEFAULT_NEW_ALIGNMENT__)
                        vptr = ::operator new(type->type_size,
                                              std::align_val_t(type->type_align));
                    else
                #endif
                vptr = ::operator new(type->type_size);
            }
        }
        value = vptr;
    }